

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLinkMarkers.cpp
# Opt level: O2

void __thiscall chrono::ChLinkMarkers::ChLinkMarkers(ChLinkMarkers *this,ChLinkMarkers *other)

{
  double dVar1;
  int iVar2;
  long lVar3;
  long lVar4;
  undefined1 auVar5 [64];
  undefined1 auVar6 [16];
  
  ChLink::ChLink(&this->super_ChLink,&other->super_ChLink);
  auVar6 = ZEXT816(0) << 0x40;
  (this->super_ChLink).super_ChLinkBase.super_ChPhysicsItem.super_ChObj._vptr_ChObj =
       (_func_int **)&PTR__ChPhysicsItem_01161f60;
  (this->relM).pos.m_data[0] = 0.0;
  (this->relM).pos.m_data[1] = 0.0;
  (this->relM).pos.m_data[2] = 0.0;
  (this->relM).rot.m_data[0] = 1.0;
  *(undefined1 (*) [32])((this->relM).rot.m_data + 1) = ZEXT1632(auVar6);
  *(undefined1 (*) [32])((this->relM).rot.m_data + 3) = ZEXT1632(auVar6);
  (this->relM_dt).rot.m_data[0] = 1.0;
  *(undefined1 (*) [32])((this->relM_dt).rot.m_data + 1) = ZEXT1632(auVar6);
  *(undefined1 (*) [32])((this->relM_dt).rot.m_data + 3) = ZEXT1632(auVar6);
  (this->relM_dtdt).rot.m_data[0] = 1.0;
  (this->relM_dtdt).rot.m_data[1] = 0.0;
  (this->relM_dtdt).rot.m_data[2] = 0.0;
  (this->relM_dtdt).rot.m_data[3] = 0.0;
  this->marker1 = (ChMarker *)0x0;
  this->marker2 = (ChMarker *)0x0;
  auVar5 = ZEXT464(0) << 0x40;
  this->relAxis = (ChVector<double>)auVar5._0_24_;
  this->relRotaxis = (ChVector<double>)auVar5._24_24_;
  (this->relWvel).m_data[0] = (double)auVar5._48_8_;
  (this->relWvel).m_data[1] = (double)auVar5._56_8_;
  *(undefined1 (*) [64])((this->relRotaxis).m_data + 1) = auVar5;
  *(undefined1 (*) [64])((this->q_BC).m_data + 3) = auVar5;
  *(undefined1 (*) [64])((this->q_AD).m_data + 1) = auVar5;
  *(undefined1 (*) [64])((this->PQw).m_data + 2) = auVar5;
  this->C_force = (ChVector<double>)auVar5._0_24_;
  this->C_torque = (ChVector<double>)auVar5._24_24_;
  (this->PQw).m_data[0] = (double)auVar5._48_8_;
  (this->PQw).m_data[1] = (double)auVar5._56_8_;
  iVar2 = other->markID2;
  this->markID1 = other->markID1;
  this->markID2 = iVar2;
  ChCoordsys<double>::operator=(&this->relM,&other->relM);
  ChCoordsys<double>::operator=(&this->relM_dt,&other->relM_dt);
  ChCoordsys<double>::operator=(&this->relM_dtdt,&other->relM_dtdt);
  this->relAngle = other->relAngle;
  if (other == this) {
    lVar3 = 0x1e8;
    lVar4 = 0x1e0;
  }
  else {
    lVar3 = 0x218;
    lVar4 = 0x210;
    (this->relRotaxis).m_data[0] = (other->relRotaxis).m_data[0];
    (this->relRotaxis).m_data[1] = (other->relRotaxis).m_data[1];
    (this->relRotaxis).m_data[2] = (other->relRotaxis).m_data[2];
    (this->relAxis).m_data[0] = (other->relAxis).m_data[0];
    (this->relAxis).m_data[1] = (other->relAxis).m_data[1];
    (this->relAxis).m_data[2] = (other->relAxis).m_data[2];
    (this->relWvel).m_data[0] = (other->relWvel).m_data[0];
    (this->relWvel).m_data[1] = (other->relWvel).m_data[1];
    (this->relWvel).m_data[2] = (other->relWvel).m_data[2];
    (this->relWacc).m_data[0] = (other->relWacc).m_data[0];
    (this->relWacc).m_data[1] = (other->relWacc).m_data[1];
    (this->relWacc).m_data[2] = (other->relWacc).m_data[2];
    dVar1 = other->dist_dt;
    this->dist = other->dist;
    this->dist_dt = dVar1;
    (this->C_force).m_data[0] = (other->C_force).m_data[0];
    (this->C_force).m_data[1] = (other->C_force).m_data[1];
    (this->C_force).m_data[2] = (other->C_force).m_data[2];
    (this->C_torque).m_data[0] = (other->C_torque).m_data[0];
  }
  *(undefined8 *)
   ((long)&(this->super_ChLink).super_ChLinkBase.super_ChPhysicsItem.super_ChObj._vptr_ChObj + lVar4
   ) = *(undefined8 *)
        ((long)&(other->super_ChLink).super_ChLinkBase.super_ChPhysicsItem.super_ChObj._vptr_ChObj +
        lVar4);
  *(undefined8 *)
   ((long)&(this->super_ChLink).super_ChLinkBase.super_ChPhysicsItem.super_ChObj._vptr_ChObj + lVar3
   ) = *(undefined8 *)
        ((long)&(other->super_ChLink).super_ChLinkBase.super_ChPhysicsItem.super_ChObj._vptr_ChObj +
        lVar3);
  return;
}

Assistant:

ChLinkMarkers::ChLinkMarkers(const ChLinkMarkers& other) : ChLink(other) {
    marker1 = NULL;
    marker2 = NULL;

    markID1 = other.markID1;
    markID2 = other.markID2;

    relM = other.relM;  // copy vars
    relM_dt = other.relM_dt;
    relM_dtdt = other.relM_dtdt;
    relAngle = other.relAngle;
    relRotaxis = other.relRotaxis;
    relAxis = other.relAxis;
    relWvel = other.relWvel;
    relWacc = other.relWacc;
    dist = other.dist;
    dist_dt = other.dist_dt;

    C_force = other.C_force;
    C_torque = other.C_torque;
}